

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

int av1_find_best_sub_pixel_tree
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  MV_COST_PARAMS *mv_cost_params;
  byte bVar1;
  SUBPEL_SEARCH_TYPE SVar2;
  ushort uVar3;
  MACROBLOCKD *pMVar4;
  int iVar5;
  int iVar6;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  undefined4 extraout_var;
  short sVar7;
  short sVar8;
  short sVar9;
  uint uVar10;
  SubpelMvLimits *pSVar11;
  AV1_COMMON *pAVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  short sVar16;
  scale_factors *sf;
  uint uVar17;
  uint uVar18;
  ushort uVar19;
  bool bVar20;
  uint local_d4;
  uint sse;
  MV left_mv;
  MV bottom_mv;
  MV top_mv;
  MV right_mv;
  MV local_a4;
  MACROBLOCKD *local_a0;
  AV1_COMMON *local_98;
  SubpelMvLimits *local_90;
  uint local_84;
  ulong local_80;
  uint local_78;
  int local_74;
  MV *local_70;
  ulong local_68;
  undefined8 local_60;
  int local_54;
  SUBPEL_MOTION_SEARCH_PARAMS *local_50;
  int local_44;
  uint local_40;
  int local_3c;
  ulong local_38;
  
  bVar1 = ms_params->forced_stop;
  local_54 = ms_params->iters_per_step;
  SVar2 = (ms_params->var_params).subpel_search_type;
  iVar5 = 3 - (uint)bVar1;
  iVar13 = 3 - (uint)(ms_params->allow_hp == 0);
  if (iVar5 < iVar13) {
    iVar13 = iVar5;
  }
  *bestmv = start_mv;
  if (((*xd->mi)->field_0xa7 & 0x80) == 0) {
    sf = xd->block_ref_scale_factors[0];
  }
  else {
    sf = &cm->sf_identity;
  }
  mv_cost_params = &ms_params->mv_cost_params;
  var_params = &ms_params->var_params;
  local_98 = cm;
  local_50 = ms_params;
  iVar5 = av1_is_scaled(sf);
  local_60 = CONCAT44(extraout_var,iVar5);
  local_a0 = xd;
  if (iVar5 == 0 && start_mv_stats != (FULLPEL_MV_STATS *)0x0) {
    local_d4 = start_mv_stats->err_cost + start_mv_stats->distortion;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  }
  else if (SVar2 == '\0') {
    local_d4 = setup_center_error(xd,bestmv,var_params,mv_cost_params,sse1,distortion);
  }
  else {
    local_d4 = upsampled_setup_center_error
                         (xd,local_98,bestmv,var_params,mv_cost_params,sse1,distortion);
  }
  uVar10 = local_d4;
  if (bVar1 != 3) {
    pSVar11 = &local_50->mv_limits;
    iVar5 = 0;
    local_3c = 0;
    if (0 < iVar13) {
      local_3c = iVar13;
    }
    uVar15 = 4;
    local_90 = pSVar11;
    local_70 = bestmv;
    local_44 = iVar13;
    for (; local_3c != iVar5; iVar5 = iVar5 + 1) {
      uVar19 = bestmv->row;
      uVar3 = bestmv->col;
      iVar13 = check_repeated_mv_and_update(last_mv_search_list,*bestmv,iVar5);
      pAVar12 = local_98;
      pMVar4 = local_a0;
      if (iVar13 != 0) break;
      sVar8 = (short)uVar15;
      local_80 = uVar15;
      local_74 = iVar5;
      local_68 = (ulong)uVar3;
      if (SVar2 == '\0') {
        sse = CONCAT22(uVar3 - sVar8,uVar19);
        left_mv.row = 0;
        left_mv.col = 0;
        local_84 = check_better_fast(local_a0,local_98,(MV *)&sse,bestmv,pSVar11,var_params,
                                     mv_cost_params,&local_d4,sse1,distortion,(int *)&left_mv,
                                     (int)local_60);
        pSVar11 = local_90;
        sVar8 = (short)local_68;
        right_mv.col = (short)local_80 + sVar8;
        right_mv.row = uVar19;
        iVar13 = (int)local_60;
        local_78 = check_better_fast(pMVar4,pAVar12,&right_mv,bestmv,local_90,var_params,
                                     mv_cost_params,&local_d4,sse1,distortion,(int *)&left_mv,iVar13
                                    );
        pAVar12 = local_98;
        top_mv.col = sVar8;
        top_mv.row = uVar19 - (short)local_80;
        local_40 = check_better_fast(pMVar4,local_98,&top_mv,local_70,pSVar11,var_params,
                                     mv_cost_params,&local_d4,sse1,distortion,(int *)&left_mv,iVar13
                                    );
        uVar15 = local_80;
        bottom_mv.col = (int16_t)local_68;
        bottom_mv.row = (short)local_80 + uVar19;
        local_38 = (ulong)uVar19;
        uVar14 = check_better_fast(local_a0,pAVar12,&bottom_mv,local_70,local_90,var_params,
                                   mv_cost_params,&local_d4,sse1,distortion,(int *)&left_mv,iVar13);
        bestmv = local_70;
        pSVar11 = local_90;
        pAVar12 = local_98;
        uVar10 = (uint)uVar15;
        uVar17 = uVar10;
        if (local_40 <= uVar14) {
          uVar17 = -uVar10;
        }
        if (local_84 <= local_78) {
          uVar10 = -uVar10;
        }
        uVar14 = uVar17 & 0xffff | uVar10 << 0x10;
        uVar19 = (ushort)local_38;
        local_a4.col = (short)local_68 + (short)uVar10;
        local_a4.row = (short)uVar17 + uVar19;
        check_better_fast(local_a0,local_98,&local_a4,local_70,local_90,var_params,mv_cost_params,
                          &local_d4,sse1,distortion,(int *)&left_mv,(int)local_60);
      }
      else {
        left_mv.col = uVar3 - sVar8;
        left_mv.row = uVar19;
        right_mv.col = uVar3 + sVar8;
        right_mv.row = uVar19;
        top_mv.col = uVar3;
        top_mv.row = uVar19 - sVar8;
        bottom_mv.col = uVar3;
        bottom_mv.row = uVar19 + sVar8;
        iVar13 = av1_is_subpelmv_in_range(pSVar11,left_mv);
        local_84 = 0x7fffffff;
        uVar10 = 0x7fffffff;
        if (iVar13 != 0) {
          iVar13 = upsampled_pref_error(local_a0,local_98,&left_mv,var_params,&sse);
          iVar5 = mv_err_cost_(&left_mv,mv_cost_params);
          uVar10 = iVar5 + iVar13;
          if (uVar10 < local_d4) {
            *bestmv = left_mv;
            *distortion = iVar13;
            *sse1 = sse;
            local_d4 = uVar10;
          }
        }
        local_78 = uVar10;
        iVar13 = av1_is_subpelmv_in_range(pSVar11,right_mv);
        if (iVar13 != 0) {
          iVar13 = upsampled_pref_error(local_a0,local_98,&right_mv,var_params,&sse);
          iVar5 = mv_err_cost_(&right_mv,mv_cost_params);
          local_84 = iVar5 + iVar13;
          if (local_84 < local_d4) {
            *bestmv = right_mv;
            *distortion = iVar13;
            *sse1 = sse;
            local_d4 = local_84;
          }
        }
        iVar13 = av1_is_subpelmv_in_range(pSVar11,top_mv);
        pAVar12 = local_98;
        uVar17 = 0x7fffffff;
        uVar10 = 0x7fffffff;
        if (iVar13 != 0) {
          iVar13 = upsampled_pref_error(local_a0,local_98,&top_mv,var_params,&sse);
          iVar5 = mv_err_cost_(&top_mv,mv_cost_params);
          uVar10 = iVar5 + iVar13;
          uVar15 = local_80;
          if (uVar10 < local_d4) {
            *local_70 = top_mv;
            *distortion = iVar13;
            *sse1 = sse;
            local_d4 = uVar10;
          }
        }
        uVar14 = (uint)uVar15;
        iVar13 = av1_is_subpelmv_in_range(pSVar11,bottom_mv);
        if (iVar13 != 0) {
          iVar13 = upsampled_pref_error(local_a0,pAVar12,&bottom_mv,var_params,&sse);
          iVar5 = mv_err_cost_(&bottom_mv,mv_cost_params);
          uVar17 = iVar5 + iVar13;
          if (uVar17 < local_d4) {
            *local_70 = bottom_mv;
            *distortion = iVar13;
            *sse1 = sse;
            local_d4 = uVar17;
          }
          uVar14 = (uint)local_80;
        }
        bestmv = local_70;
        uVar18 = uVar14;
        if (uVar10 <= uVar17) {
          uVar18 = -uVar14;
        }
        if (local_78 <= local_84) {
          uVar14 = -uVar14;
        }
        local_a4.col = (short)local_68 + (short)uVar14;
        local_a4.row = uVar19 + (short)uVar18;
        iVar13 = av1_is_subpelmv_in_range(local_90,local_a4);
        if (iVar13 != 0) {
          iVar13 = upsampled_pref_error(local_a0,local_98,&local_a4,var_params,&sse);
          iVar5 = mv_err_cost_(&local_a4,mv_cost_params);
          if ((uint)(iVar5 + iVar13) < local_d4) {
            *bestmv = local_a4;
            *distortion = iVar13;
            *sse1 = sse;
            local_d4 = iVar5 + iVar13;
          }
        }
        uVar14 = uVar18 & 0xffff | uVar14 << 0x10;
        pAVar12 = local_98;
        pSVar11 = local_90;
      }
      iVar5 = local_74;
      pMVar4 = local_a0;
      uVar3 = bestmv->row;
      sVar16 = (short)local_68;
      sVar8 = (short)(uVar14 >> 0x10);
      if (uVar19 == uVar3) {
        if ((sVar16 != bestmv->col && 1 < local_54) && (sVar7 = bestmv->col, sVar16 != sVar7)) {
          uVar14 = -uVar14;
          sVar9 = sVar8;
LAB_002a6ff5:
          left_mv.row = (short)uVar14 + uVar3;
          left_mv.col = sVar7;
          right_mv.col = sVar7 + sVar9;
          right_mv.row = uVar3;
          bottom_mv.row = 0;
          bottom_mv.col = 0;
          top_mv.col = sVar7 + sVar9;
          top_mv.row = left_mv.row;
          if ((local_50->var_params).subpel_search_type == '\0') {
            iVar13 = (int)local_60;
            check_better_fast(local_a0,pAVar12,&left_mv,bestmv,pSVar11,var_params,mv_cost_params,
                              &local_d4,sse1,distortion,(int *)&bottom_mv,iVar13);
            iVar5 = local_74;
            pSVar11 = local_90;
            check_better_fast(pMVar4,pAVar12,&right_mv,bestmv,local_90,var_params,mv_cost_params,
                              &local_d4,sse1,distortion,(int *)&bottom_mv,iVar13);
            if (bottom_mv != (MV)0x0) {
              check_better_fast(local_a0,pAVar12,&top_mv,bestmv,pSVar11,var_params,mv_cost_params,
                                &local_d4,sse1,distortion,(int *)&bottom_mv,(int)local_60);
            }
          }
          else {
            iVar13 = av1_is_subpelmv_in_range(pSVar11,left_mv);
            if (iVar13 == 0) {
              bVar20 = false;
            }
            else {
              iVar13 = upsampled_pref_error(local_a0,pAVar12,&left_mv,var_params,&sse);
              iVar6 = mv_err_cost_(&left_mv,mv_cost_params);
              bVar20 = (uint)(iVar6 + iVar13) < local_d4;
              pSVar11 = local_90;
              pAVar12 = local_98;
              if (bVar20) {
                *bestmv = left_mv;
                *distortion = iVar13;
                *sse1 = sse;
                local_d4 = iVar6 + iVar13;
              }
            }
            iVar13 = av1_is_subpelmv_in_range(pSVar11,right_mv);
            if (iVar13 != 0) {
              iVar13 = upsampled_pref_error(local_a0,pAVar12,&right_mv,var_params,&sse);
              iVar6 = mv_err_cost_(&right_mv,mv_cost_params);
              pSVar11 = local_90;
              pAVar12 = local_98;
              if ((uint)(iVar6 + iVar13) < local_d4) {
                *bestmv = right_mv;
                *distortion = iVar13;
                *sse1 = sse;
                bottom_mv.row = 1;
                bottom_mv.col = 0;
                bVar20 = true;
                local_d4 = iVar6 + iVar13;
              }
            }
            if ((bVar20) && (iVar13 = av1_is_subpelmv_in_range(pSVar11,top_mv), iVar13 != 0)) {
              iVar13 = upsampled_pref_error(local_a0,pAVar12,&top_mv,var_params,&sse);
              iVar6 = mv_err_cost_(&top_mv,mv_cost_params);
              if ((uint)(iVar6 + iVar13) < local_d4) {
                *bestmv = top_mv;
                *distortion = iVar13;
                *sse1 = sse;
                local_d4 = iVar6 + iVar13;
              }
            }
          }
        }
      }
      else if (1 < local_54) {
        sVar7 = bestmv->col;
        sVar9 = -sVar8;
        if (sVar16 != sVar7) {
          sVar9 = sVar8;
        }
        goto LAB_002a6ff5;
      }
      uVar15 = local_80 >> 1 & 0x7fffffff;
    }
    uVar10 = 0x7fffffff;
    if (local_44 <= iVar5) {
      uVar10 = local_d4;
    }
  }
  return uVar10;
}

Assistant:

int av1_find_best_sub_pixel_tree(MACROBLOCKD *xd, const AV1_COMMON *const cm,
                                 const SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                 MV start_mv,
                                 const FULLPEL_MV_STATS *start_mv_stats,
                                 MV *bestmv, int *distortion,
                                 unsigned int *sse1,
                                 int_mv *last_mv_search_list) {
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;
  const SUBPEL_SEARCH_TYPE subpel_search_type =
      ms_params->var_params.subpel_search_type;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;

  // How many steps to take. A round of 0 means fullpel search only, 1 means
  // half-pel, and so on.
  const int round = AOMMIN(FULL_PEL - forced_stop, 3 - !allow_hp);
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel

  unsigned int besterr = INT_MAX;

  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    if (subpel_search_type != USE_2_TAPS_ORIG) {
      besterr = upsampled_setup_center_error(xd, cm, bestmv, var_params,
                                             mv_cost_params, sse1, distortion);
    } else {
      besterr = setup_center_error(xd, bestmv, var_params, mv_cost_params, sse1,
                                   distortion);
    }
  }

  // If forced_stop is FULL_PEL, return.
  if (!round) return besterr;

  for (int iter = 0; iter < round; ++iter) {
    MV iter_center_mv = *bestmv;
    if (check_repeated_mv_and_update(last_mv_search_list, iter_center_mv,
                                     iter)) {
      return INT_MAX;
    }

    MV diag_step;
    if (subpel_search_type != USE_2_TAPS_ORIG) {
      diag_step = first_level_check(xd, cm, iter_center_mv, bestmv, hstep,
                                    mv_limits, var_params, mv_cost_params,
                                    &besterr, sse1, distortion);
    } else {
      diag_step = first_level_check_fast(xd, cm, iter_center_mv, bestmv, hstep,
                                         mv_limits, var_params, mv_cost_params,
                                         &besterr, sse1, distortion, is_scaled);
    }

    // Check diagonal sub-pixel position
    if (!CHECK_MV_EQUAL(iter_center_mv, *bestmv) && iters_per_step > 1) {
      second_level_check_v2(xd, cm, iter_center_mv, diag_step, bestmv,
                            mv_limits, var_params, mv_cost_params, &besterr,
                            sse1, distortion, is_scaled);
    }

    hstep >>= 1;
  }

  return besterr;
}